

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O0

void __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::_logNode
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this,BaseNode *node,uint32_t indentation
          ,char *action)

{
  byte *pbVar1;
  long lVar2;
  ulong uVar3;
  long in_RCX;
  long in_RDI;
  BaseNode *in_stack_000000d0;
  BaseBuilder *in_stack_000000d8;
  FormatOptions *in_stack_000000e0;
  String *in_stack_000000e8;
  undefined8 in_stack_ffffffffffffff20;
  String *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  String *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  ModifyOp op;
  String *in_stack_ffffffffffffff48;
  
  op = (ModifyOp)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  String::clear((String *)(in_RDI + 0x68));
  String::_opChars(in_stack_ffffffffffffff38,(ModifyOp)(in_stack_ffffffffffffff30 >> 0x20),
                   (char)(in_stack_ffffffffffffff30 >> 0x18),(size_t)in_stack_ffffffffffffff28);
  if (in_RCX != 0) {
    String::_opString(in_stack_ffffffffffffff48,op,(char *)in_stack_ffffffffffffff38,
                      in_stack_ffffffffffffff30);
    String::_opChar(in_stack_ffffffffffffff28,(ModifyOp)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                    (char)((ulong)in_stack_ffffffffffffff20 >> 0x18));
  }
  Formatter::formatNode(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  String::_opChar(in_stack_ffffffffffffff28,(ModifyOp)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                  (char)((ulong)in_stack_ffffffffffffff20 >> 0x18));
  pbVar1 = (byte *)(in_RDI + 0x68);
  if (*pbVar1 < 0x1f) {
    lVar2 = in_RDI + 0x69;
  }
  else {
    lVar2 = *(long *)(in_RDI + 0x80);
  }
  if (*pbVar1 < 0x1f) {
    uVar3 = (ulong)*pbVar1;
  }
  else {
    uVar3 = *(ulong *)(in_RDI + 0x70);
  }
  (**(code **)(**(long **)(in_RDI + 0x50) + 0x10))(*(long **)(in_RDI + 0x50),lVar2,uVar3);
  return;
}

Assistant:

void _logNode(BaseNode* node, uint32_t indentation, const char* action) noexcept {
    _sb.clear();
    _sb.appendChars(' ', indentation);
    if (action) {
      _sb.append(action);
      _sb.append(' ');
    }
    Formatter::formatNode(_sb, _formatOptions, cc(), node);
    _sb.append('\n');
    _logger->log(_sb);
  }